

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O1

void strcpy_safe(char *destination,char *source,int maxLength)

{
  ulong uVar1;
  ulong uVar2;
  
  if (maxLength < 1) {
    uVar2 = 0;
  }
  else {
    uVar1 = 0;
    do {
      destination[uVar1] = source[uVar1];
      uVar2 = uVar1;
      if (source[uVar1] == '\0') break;
      uVar1 = uVar1 + 1;
      uVar2 = (ulong)(uint)maxLength;
    } while ((uint)maxLength != uVar1);
    uVar2 = uVar2 & 0xffffffff;
  }
  destination[uVar2] = '\0';
  return;
}

Assistant:

void strcpy_safe( char *destination, char const*source, int maxLength ) {
    int i = 0;
    for( i = 0; i < maxLength; i++ ) {
        destination[i] = source[i];
        if( source[i] == 0 ) {
            break;
        }
    }
    destination[i] = 0;
}